

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O2

bool ft::
     lexicographical_compare<ft::constListIterator<int>,ft::constListIterator<int>,ft::less<int>>
               (long first1,long last1,long first2,long last2)

{
  int *piVar1;
  int *piVar2;
  
  while( true ) {
    piVar1 = *(int **)(first1 + 8);
    piVar2 = *(int **)(first2 + 8);
    if (piVar1 == *(int **)(last1 + 8)) {
      return piVar2 != *(int **)(last2 + 8);
    }
    if (piVar2 == *(int **)(last2 + 8)) {
      return false;
    }
    if (*piVar2 < *piVar1) {
      return false;
    }
    if (*piVar1 < *piVar2) break;
    *(undefined8 *)(first1 + 8) = *(undefined8 *)(piVar1 + 4);
    *(undefined8 *)(first2 + 8) = *(undefined8 *)(*(long *)(first2 + 8) + 0x10);
  }
  return true;
}

Assistant:

bool lexicographical_compare(Iterator1 first1, Iterator1 last1, Iterator2 first2, Iterator2 last2, Compare comp,
							 typename ft::_void_t<typename ft::iterator_traits<Iterator1>::iterator_category>::type * = 0,
							 typename ft::_void_t<typename ft::iterator_traits<Iterator2>::iterator_category>::type * = 0) {
	while (first1 != last1) {
		if (first2 == last2 || comp(*first2, *first1)) return false;
		else if (comp(*first1, *first2)) return true;
		++first1; ++first2;
	}
	return first2 != last2;
}